

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void golf_lightmap_image_finalize(golf_lightmap_image_t *lightmap)

{
  sg_image *psVar1;
  sg_image sVar2;
  void *mem;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  sg_image_desc img_desc;
  sg_image_desc sStack_6c8;
  
  if (0 < lightmap->num_samples) {
    lVar6 = 0;
    do {
      mem = golf_alloc_tracked((long)lightmap->height * (long)lightmap->width * 4,
                               "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/level.c"
                              );
      iVar7 = lightmap->width;
      iVar8 = lightmap->height;
      iVar5 = iVar7 * iVar8 * 4;
      if (0 < iVar7 * iVar8 * 4) {
        lVar3 = 0;
        lVar4 = 0;
        do {
          *(uchar *)((long)mem + lVar3 * 4) = lightmap->data[lVar6][lVar3];
          *(uchar *)((long)mem + lVar3 * 4 + 1) = lightmap->data[lVar6][lVar3];
          *(uchar *)((long)mem + lVar3 * 4 + 2) = lightmap->data[lVar6][lVar3];
          *(undefined1 *)((long)mem + lVar3 * 4 + 3) = 0xff;
          lVar4 = lVar4 + 4;
          iVar7 = lightmap->width;
          iVar8 = lightmap->height;
          iVar5 = iVar7 * iVar8 * 4;
          lVar3 = lVar3 + 1;
        } while (lVar4 < iVar5);
      }
      memset(&sStack_6c8,0,0x698);
      sStack_6c8.pixel_format = SG_PIXELFORMAT_RGBA8;
      sStack_6c8.min_filter = SG_FILTER_LINEAR;
      sStack_6c8.mag_filter = SG_FILTER_LINEAR;
      sStack_6c8.wrap_u = SG_WRAP_CLAMP_TO_EDGE;
      sStack_6c8.wrap_v = SG_WRAP_CLAMP_TO_EDGE;
      sStack_6c8.data.subimage[0][0].size = (size_t)iVar5;
      psVar1 = lightmap->sg_image;
      sStack_6c8.width = iVar7;
      sStack_6c8.height = iVar8;
      sStack_6c8.data.subimage[0][0].ptr = mem;
      sVar2 = sg_make_image(&sStack_6c8);
      psVar1[lVar6].id = sVar2.id;
      golf_free_tracked(mem);
      lVar6 = lVar6 + 1;
    } while (lVar6 < lightmap->num_samples);
  }
  return;
}

Assistant:

void golf_lightmap_image_finalize(golf_lightmap_image_t *lightmap) {
    for (int s = 0; s < lightmap->num_samples; s++) {
        unsigned char *sg_image_data = golf_alloc(4 * lightmap->width * lightmap->height);
        for (int i = 0; i < 4 * lightmap->width * lightmap->height; i += 4) {
            sg_image_data[i + 0] = lightmap->data[s][i / 4];
            sg_image_data[i + 1] = lightmap->data[s][i / 4];
            sg_image_data[i + 2] = lightmap->data[s][i / 4];
            sg_image_data[i + 3] = 0xFF;
        }
        sg_image_desc img_desc = {
            .width = lightmap->width,
            .height = lightmap->height,
            .pixel_format = SG_PIXELFORMAT_RGBA8,
            .min_filter = SG_FILTER_LINEAR,
            .mag_filter = SG_FILTER_LINEAR,
            .wrap_u = SG_WRAP_CLAMP_TO_EDGE,
            .wrap_v = SG_WRAP_CLAMP_TO_EDGE,
            .data.subimage[0][0] = {
                .ptr = sg_image_data,
                .size = 4 * lightmap->width * lightmap->height,
            },
        };
        lightmap->sg_image[s] = sg_make_image(&img_desc);
        golf_free(sg_image_data);
    }
}